

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::SearchWithAnchoring<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,bool anchorBegin,bool anchorEnd)

{
  bool bVar1;
  size_t __n;
  State *pSVar2;
  State *pSVar3;
  bool bVar4;
  bool local_81;
  State *sr;
  SizeType *s;
  uint codepoint;
  bool matched;
  size_t stateSetSize;
  Stack<rapidjson::CrtAllocator> *next;
  Stack<rapidjson::CrtAllocator> *current;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  bool anchorEnd_local;
  bool anchorBegin_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  ds._14_1_ = anchorEnd;
  ds._15_1_ = anchorBegin;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>::
  DecodedStream((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                 *)&current,is);
  Stack<rapidjson::CrtAllocator>::Clear((Stack<rapidjson::CrtAllocator> *)(this + 0x18));
  next = (Stack<rapidjson::CrtAllocator> *)(this + 0x18);
  stateSetSize = (size_t)(this + 0x48);
  __n = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        ::GetStateSetSize((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           *)this);
  memset(*(void **)(this + 0x78),0,__n);
  s._7_1_ = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)this,next,*(SizeType *)(*(long *)this + 0x70));
  do {
    bVar1 = Stack<rapidjson::CrtAllocator>::Empty(next);
    bVar4 = false;
    if (!bVar1) {
      s._0_4_ = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                ::Take((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                        *)&current);
      bVar4 = (uint)s != 0;
    }
    if (!bVar4) {
      return s._7_1_;
    }
    memset(*(void **)(this + 0x78),0,__n);
    Stack<rapidjson::CrtAllocator>::Clear((Stack<rapidjson::CrtAllocator> *)stateSetSize);
    s._7_1_ = false;
    for (sr = (State *)Stack<rapidjson::CrtAllocator>::Bottom<unsigned_int>(next);
        pSVar2 = (State *)Stack<rapidjson::CrtAllocator>::End<unsigned_int>(next), sr != pSVar2;
        sr = (State *)&sr->out1) {
      pSVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetState
                         (*(GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)this,
                          sr->out);
      if (((pSVar3->codepoint == (uint)s) || (pSVar3->codepoint == 0xffffffff)) ||
         ((pSVar3->codepoint == 0xfffffffe &&
          (bVar4 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::MatchRange((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                 *)this,pSVar3->rangeStart,(uint)s), bVar4)))) {
        bVar4 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                            *)this,(Stack<rapidjson::CrtAllocator> *)stateSetSize,pSVar3->out);
        local_81 = true;
        if (!bVar4) {
          local_81 = s._7_1_;
        }
        s._7_1_ = local_81;
        if (((ds._14_1_ & 1) == 0) && (local_81 != false)) {
          return true;
        }
      }
      if ((ds._15_1_ & 1) == 0) {
        GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    *)this,(Stack<rapidjson::CrtAllocator> *)stateSetSize,
                   *(SizeType *)(*(long *)this + 0x70));
      }
    }
    Swap<rapidjson::internal::Stack<rapidjson::CrtAllocator>*>
              (&next,(Stack<rapidjson::CrtAllocator> **)&stateSetSize);
  } while( true );
}

Assistant:

bool SearchWithAnchoring(InputStream& is, bool anchorBegin, bool anchorEnd) {
        DecodedStream<InputStream, Encoding> ds(is);

        state0_.Clear();
        Stack<Allocator> *current = &state0_, *next = &state1_;
        const size_t stateSetSize = GetStateSetSize();
        std::memset(stateSet_, 0, stateSetSize);

        bool matched = AddState(*current, regex_.root_);
        unsigned codepoint;
        while (!current->Empty() && (codepoint = ds.Take()) != 0) {
            std::memset(stateSet_, 0, stateSetSize);
            next->Clear();
            matched = false;
            for (const SizeType* s = current->template Bottom<SizeType>(); s != current->template End<SizeType>(); ++s) {
                const State& sr = regex_.GetState(*s);
                if (sr.codepoint == codepoint ||
                    sr.codepoint == RegexType::kAnyCharacterClass || 
                    (sr.codepoint == RegexType::kRangeCharacterClass && MatchRange(sr.rangeStart, codepoint)))
                {
                    matched = AddState(*next, sr.out) || matched;
                    if (!anchorEnd && matched)
                        return true;
                }
                if (!anchorBegin)
                    AddState(*next, regex_.root_);
            }
            internal::Swap(current, next);
        }

        return matched;
    }